

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_algebra.h
# Opt level: O1

complex dja::normalize(complex *z)

{
  float fVar1;
  float fVar2;
  complex cVar3;
  float fVar4;
  
  fVar1 = z->re;
  fVar2 = z->im;
  fVar4 = fVar1 * fVar1 + fVar2 * fVar2;
  if (fVar4 < 0.0) {
    fVar4 = sqrtf(fVar4);
  }
  else {
    fVar4 = SQRT(fVar4);
  }
  cVar3.im = fVar2 * (1.0 / fVar4);
  cVar3.re = fVar1 * (1.0 / fVar4);
  return cVar3;
}

Assistant:

Z normalize(const Z& z) {return Z(normalize(V2(z)));}